

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::prepareShaderSource
          (BindingImagesTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  TestError *this_00;
  reference pvVar1;
  GLchar *pGVar2;
  size_t sVar3;
  size_t local_68;
  size_t position;
  GLchar *local_50;
  GLchar *tex_coord_type;
  GLchar *shader_template;
  GLchar *pGStack_38;
  GLuint n_coordinates;
  GLchar *image_type;
  GLchar *coordinates_write;
  GLchar *coordinates_read;
  shaderSource *out_source_local;
  bool in_use_version_400_local;
  BindingImagesTest *pBStack_10;
  SHADER_STAGES in_stage_local;
  BindingImagesTest *this_local;
  
  coordinates_write = (GLchar *)0x0;
  image_type = (GLchar *)0x0;
  coordinates_read = (GLchar *)out_source;
  out_source_local._3_1_ = in_use_version_400;
  out_source_local._4_4_ = in_stage;
  pBStack_10 = this;
  pGStack_38 = Utils::getImageType(this->m_test_case);
  shader_template._4_4_ = Utils::getNumberOfCoordinates(this->m_test_case);
  tex_coord_type = (GLchar *)0x0;
  local_50 = Utils::getTypeName(INT,1,shader_template._4_4_);
  switch(out_source_local._4_4_) {
  case COMPUTE_SHADER:
    tex_coord_type = prepareShaderSource::compute_shader_template;
    break;
  case VERTEX_SHADER:
    tex_coord_type = prepareShaderSource::vertex_shader_template;
    break;
  case TESS_CTRL_SHADER:
    tex_coord_type = prepareShaderSource::tess_ctrl_shader_template;
    break;
  case TESS_EVAL_SHADER:
    tex_coord_type = prepareShaderSource::tess_eval_shader_template;
    break;
  case GEOMETRY_SHADER:
    tex_coord_type = prepareShaderSource::geometry_shader_template;
    break;
  case FRAGMENT_SHADER:
    tex_coord_type = prepareShaderSource::fragment_shader_template;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x2e6b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pGVar2 = tex_coord_type;
  switch(shader_template._4_4_) {
  case 1:
    coordinates_write = "1";
    image_type = "0";
    break;
  case 2:
    coordinates_write = "1, 0";
    image_type = "0, 0";
    break;
  case 3:
    coordinates_write = "1, 0, 0";
    image_type = "0, 0, 0";
    break;
  case 4:
    coordinates_write = "1, 0, 0, 0";
    image_type = "0, 0, 0, 0";
  }
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  std::__cxx11::string::operator=((string *)pvVar1,pGVar2);
  local_68 = 0;
  pGVar2 = TestBase::getVersionString
                     ((TestBase *)this,out_source_local._4_4_,(bool)(out_source_local._3_1_ & 1));
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceToken("VERSION",&local_68,pGVar2,&pvVar1->m_code);
  pGVar2 = prepareShaderSource::verification_snippet;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceToken("VERIFICATION",&local_68,pGVar2,&pvVar1->m_code);
  sVar3 = strlen(prepareShaderSource::verification_snippet);
  pGVar2 = coordinates_write;
  local_68 = local_68 - sVar3;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceToken("COORDINATES",&local_68,pGVar2,&pvVar1->m_code);
  pGVar2 = image_type;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceToken("COORDINATES",&local_68,pGVar2,&pvVar1->m_code);
  pGVar2 = prepareShaderSource::uni_goku;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceAllTokens("UNI_GOKU",pGVar2,&pvVar1->m_code);
  pGVar2 = prepareShaderSource::uni_vegeta;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceAllTokens("UNI_VEGETA",pGVar2,&pvVar1->m_code);
  pGVar2 = prepareShaderSource::uni_trunks;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceAllTokens("UNI_TRUNKS",pGVar2,&pvVar1->m_code);
  pGVar2 = local_50;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceAllTokens("TEX_COORD_TYPE",pGVar2,&pvVar1->m_code);
  pGVar2 = pGStack_38;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)coordinates_read,0);
  Utils::replaceAllTokens("TYPE",pGVar2,&pvVar1->m_code);
  return;
}

Assistant:

void BindingImagesTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
											Utils::shaderSource& out_source)
{
	static const GLchar* uni_goku = "layout(binding = 1, rgba8) uniform TYPE goku;\n";

	static const GLchar* uni_vegeta = "layout(binding = 2, rgba8) uniform TYPE vegeta;\n";

	static const GLchar* uni_trunks = "layout(binding = 4, rgba8) uniform TYPE trunks;\n\n";

	static const GLchar* verification_snippet = "    TEX_COORD_TYPE tex_coord_read  = TEX_COORD_TYPE(COORDINATES);\n"
												"    TEX_COORD_TYPE tex_coord_write = TEX_COORD_TYPE(COORDINATES);\n"
												"    vec4 goku_color   = imageLoad(goku,   tex_coord_read);\n"
												"    vec4 vegeta_color = imageLoad(vegeta, tex_coord_read);\n"
												"    vec4 trunks_color = imageLoad(trunks, tex_coord_read);\n"
												"\n"
												"    imageStore(goku,   tex_coord_write, vec4(0, 1, 0, 1));\n"
												"    imageStore(vegeta, tex_coord_write, vec4(0, 1, 0, 1));\n"
												"    imageStore(trunks, tex_coord_write, vec4(0, 1, 0, 1));\n"
												"\n"
												"    if ((vec4(1, 0, 0, 0) != goku_color)   ||\n"
												"        (vec4(0, 1, 0, 0) != vegeta_color) ||\n"
												"        (vec4(0, 0, 1, 0) != trunks_color)  )\n"
												"    {\n"
												"        result = goku_color;\n"
												"        //result = vec4(1, 0, 0, 1);\n"
												"    }\n";

	static const GLchar* compute_shader_template =
		"VERSION\n"
		"#extension GL_ARB_shader_image_load_store : enable\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"writeonly uniform image2D uni_image;\n"
		"\n"
		"UNI_GOKU\n"
		"UNI_VEGETA\n"
		"UNI_TRUNKS\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"    if(gl_GlobalInvocationID.xy == vec2(0, 0)) {\n"
		"VERIFICATION"
		"    }\n"
		"\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), result);\n"
		"}\n"
		"\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"#extension GL_ARB_shader_image_load_store : enable\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"\n"
													"UNI_GOKU\n"
													"UNI_VEGETA\n"
													"UNI_TRUNKS\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"#extension GL_ARB_shader_image_load_store : enable\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"\n"
													"UNI_TRUNKS\n"
													"UNI_GOKU\n"
													"UNI_VEGETA\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"#extension GL_ARB_shader_image_load_store : enable\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"UNI_VEGETA\n"
		"UNI_TRUNKS\n"
		"UNI_GOKU\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "#extension GL_ARB_shader_image_load_store : enable\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "\n"
													 "UNI_GOKU\n"
													 "UNI_TRUNKS\n"
													 "UNI_VEGETA\n"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "#extension GL_ARB_shader_image_load_store : enable\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "\n"
												  "UNI_TRUNKS\n"
												  "UNI_VEGETA\n"
												  "UNI_GOKU\n"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	const GLchar* coordinates_read  = 0;
	const GLchar* coordinates_write = 0;
	const GLchar* image_type		= Utils::getImageType(m_test_case);
	GLuint		  n_coordinates		= Utils::getNumberOfCoordinates(m_test_case);
	const GLchar* shader_template   = 0;
	const GLchar* tex_coord_type	= Utils::getTypeName(Utils::INT, 1 /* n_columns */, n_coordinates);

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = compute_shader_template;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	switch (n_coordinates)
	{
	case 1:
		coordinates_read  = "1";
		coordinates_write = "0";
		break;
	case 2:
		coordinates_read  = "1, 0";
		coordinates_write = "0, 0";
		break;
	case 3:
		coordinates_read  = "1, 0, 0";
		coordinates_write = "0, 0, 0";
		break;
	case 4:
		coordinates_read  = "1, 0, 0, 0";
		coordinates_write = "0, 0, 0, 0";
		break;
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;

	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);

	position -= strlen(verification_snippet);

	Utils::replaceToken("COORDINATES", position, coordinates_read, out_source.m_parts[0].m_code);

	Utils::replaceToken("COORDINATES", position, coordinates_write, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("UNI_GOKU", uni_goku, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("UNI_VEGETA", uni_vegeta, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("UNI_TRUNKS", uni_trunks, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("TEX_COORD_TYPE", tex_coord_type, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("TYPE", image_type, out_source.m_parts[0].m_code);
}